

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.cpp
# Opt level: O0

InputStack * miniscript::internal::operator+(InputStack *a,InputStack *b)

{
  int *in_RDX;
  InputStack *in_RSI;
  InputStack *in_RDI;
  long in_FS_OFFSET;
  InputStack *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  Availability in_stack_ffffffffffffff74;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *v2;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffffa0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  v2 = local_38;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_ffffffffffffff68,
           (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)0xf06135);
  Cat<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            (in_stack_ffffffffffffffa0,v2);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)in_RSI,
              (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_RSI);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_RSI);
  if ((in_RSI->available != NO) && (*in_RDX != 0)) {
    in_RSI->size = *(long *)(in_RDX + 2) + in_RSI->size;
  }
  in_RSI->has_sig = (in_RSI->has_sig & 1U) != 0 || (*(byte *)(in_RDX + 1) & 1) != 0;
  in_RSI->malleable = (in_RSI->malleable & 1U) != 0 || (*(byte *)((long)in_RDX + 5) & 1) != 0;
  in_RSI->non_canon = (in_RSI->non_canon & 1U) != 0 || (*(byte *)((long)in_RDX + 6) & 1) != 0;
  if ((in_RSI->available == NO) || (*in_RDX == 0)) {
    InputStack::SetAvailable(in_RSI,in_stack_ffffffffffffff74);
  }
  else if ((in_RSI->available == MAYBE) || (*in_RDX == 2)) {
    InputStack::SetAvailable(in_RSI,in_stack_ffffffffffffff74);
  }
  InputStack::InputStack(in_stack_ffffffffffffff68,(InputStack *)0xf0627e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

InputStack operator+(InputStack a, InputStack b) {
    a.stack = Cat(std::move(a.stack), std::move(b.stack));
    if (a.available != Availability::NO && b.available != Availability::NO) a.size += b.size;
    a.has_sig |= b.has_sig;
    a.malleable |= b.malleable;
    a.non_canon |= b.non_canon;
    if (a.available == Availability::NO || b.available == Availability::NO) {
        a.SetAvailable(Availability::NO);
    } else if (a.available == Availability::MAYBE || b.available == Availability::MAYBE) {
        a.SetAvailable(Availability::MAYBE);
    }
    return a;
}